

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O3

void __thiscall perfetto::MetatraceWriter::~MetatraceWriter(MetatraceWriter *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  TraceWriter *pTVar1;
  
  Disable(this);
  *(this->weak_ptr_factory_).weak_ptr_.handle_.
   super___shared_ptr<perfetto::MetatraceWriter_*,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type)0x0;
  this_00 = (this->weak_ptr_factory_).weak_ptr_.handle_.
            super___shared_ptr<perfetto::MetatraceWriter_*,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  pTVar1 = (this->trace_writer_)._M_t.
           super___uniq_ptr_impl<perfetto::TraceWriter,_std::default_delete<perfetto::TraceWriter>_>
           ._M_t.
           super__Tuple_impl<0UL,_perfetto::TraceWriter_*,_std::default_delete<perfetto::TraceWriter>_>
           .super__Head_base<0UL,_perfetto::TraceWriter_*,_false>._M_head_impl;
  if (pTVar1 != (TraceWriter *)0x0) {
    (*(pTVar1->super_TraceWriterBase)._vptr_TraceWriterBase[1])();
  }
  (this->trace_writer_)._M_t.
  super___uniq_ptr_impl<perfetto::TraceWriter,_std::default_delete<perfetto::TraceWriter>_>._M_t.
  super__Tuple_impl<0UL,_perfetto::TraceWriter_*,_std::default_delete<perfetto::TraceWriter>_>.
  super__Head_base<0UL,_perfetto::TraceWriter_*,_false>._M_head_impl = (TraceWriter *)0x0;
  return;
}

Assistant:

MetatraceWriter::~MetatraceWriter() {
  Disable();
}